

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O1

int Abc_NtkRefactor(Abc_Ntk_t *pNtk,int nNodeSizeMax,int nConeSizeMax,int fUpdateLevel,int fUseZeros
                   ,int fUseDcs,int fVerbose)

{
  Abc_Obj_t *pRoot;
  int iVar1;
  Abc_ManCut_t *p;
  Abc_ManRef_t *p_00;
  Vec_Ptr_t *pVVar2;
  ProgressBar *p_01;
  Dec_Graph_t *pGraph;
  int fUseDcs_00;
  long lVar3;
  long lVar4;
  long lVar5;
  char *__assertion;
  int in_stack_ffffffffffffff88;
  timespec local_70;
  int local_5c;
  Abc_ManRef_t *local_58;
  int local_50;
  int local_4c;
  long local_48;
  Abc_ManCut_t *local_40;
  long local_38;
  
  local_5c = fUpdateLevel;
  local_50 = fUseZeros;
  local_4c = fUseDcs;
  iVar1 = clock_gettime(3,&local_70);
  if (iVar1 < 0) {
    local_48 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    local_48 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRefactor.c"
                  ,0x152,"int Abc_NtkRefactor(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  p = Abc_NtkManCutStart(nNodeSizeMax,nConeSizeMax,2,1000);
  p_00 = Abc_NtkManRefStart(nNodeSizeMax,nConeSizeMax,fUseDcs_00,fVerbose);
  local_40 = p;
  pVVar2 = Abc_NtkManCutReadCutLarge(p);
  p_00->vLeaves = pVVar2;
  if (local_5c != 0) {
    Abc_NtkStartReverseLevels(pNtk,0);
  }
  p_00->nNodesBeg = pNtk->nObjCounts[7];
  iVar1 = pNtk->vObjs->nSize;
  p_01 = Extra_ProgressBarStart(_stdout,iVar1);
  pVVar2 = pNtk->vObjs;
  if (0 < pVVar2->nSize) {
    local_38 = (long)iVar1;
    lVar3 = 0;
    local_58 = p_00;
    do {
      pRoot = (Abc_Obj_t *)pVVar2->pArray[lVar3];
      if ((pRoot != (Abc_Obj_t *)0x0) && ((*(uint *)&pRoot->field_0x14 & 0xf) == 7)) {
        if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= lVar3)) {
          Extra_ProgressBarUpdate_int(p_01,(int)lVar3,(char *)0x0);
        }
        if (((ulong)pRoot & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_002fe3bf:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (pRoot->pNtk->ntkType != ABC_NTK_STRASH) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_002fe3bf;
        }
        if ((pRoot->vFanins).nSize != 2) {
          __assert_fail("Abc_AigNodeIsAnd(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x193,"int Abc_NodeIsPersistant(Abc_Obj_t *)");
        }
        if (((pRoot->field_0x15 & 2) == 0) && ((pRoot->vFanouts).nSize < 0x3e9)) {
          if (local_38 <= lVar3) break;
          iVar1 = clock_gettime(3,&local_70);
          if (iVar1 < 0) {
            lVar4 = 1;
          }
          else {
            lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
            lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_70.tv_sec * -1000000;
          }
          pVVar2 = Abc_NodeFindCut(local_40,pRoot,local_4c);
          iVar1 = clock_gettime(3,&local_70);
          if (iVar1 < 0) {
            lVar5 = -1;
          }
          else {
            lVar5 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
          }
          local_58->timeCut = local_58->timeCut + lVar5 + lVar4;
          iVar1 = clock_gettime(3,&local_70);
          if (iVar1 < 0) {
            lVar4 = 1;
          }
          else {
            lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
            lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_70.tv_sec * -1000000;
          }
          pGraph = Abc_NodeRefactor(local_58,pRoot,pVVar2,local_5c,local_50,fUseDcs,
                                    in_stack_ffffffffffffff88);
          iVar1 = clock_gettime(3,&local_70);
          if (iVar1 < 0) {
            lVar5 = -1;
          }
          else {
            lVar5 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
          }
          local_58->timeRes = local_58->timeRes + lVar5 + lVar4;
          p_00 = local_58;
          if (pGraph != (Dec_Graph_t *)0x0) {
            iVar1 = clock_gettime(3,&local_70);
            if (iVar1 < 0) {
              lVar4 = 1;
            }
            else {
              lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
              lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_70.tv_sec * -1000000;
            }
            Dec_GraphUpdateNetwork(pRoot,pGraph,local_5c,local_58->nLastGain);
            iVar1 = clock_gettime(3,&local_70);
            p_00 = local_58;
            if (iVar1 < 0) {
              lVar5 = -1;
            }
            else {
              lVar5 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
            }
            local_58->timeNtk = local_58->timeNtk + lVar5 + lVar4;
            if (pGraph->pNodes != (Dec_Node_t *)0x0) {
              free(pGraph->pNodes);
              pGraph->pNodes = (Dec_Node_t *)0x0;
            }
            free(pGraph);
          }
        }
      }
      lVar3 = lVar3 + 1;
      pVVar2 = pNtk->vObjs;
    } while (lVar3 < pVVar2->nSize);
  }
  Extra_ProgressBarStop(p_01);
  iVar1 = clock_gettime(3,&local_70);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
  }
  p_00->timeTotal = lVar3 + local_48;
  p_00->nNodesEnd = pNtk->nObjCounts[7];
  if (fVerbose != 0) {
    Abc_NtkManRefPrintStats(p_00);
  }
  Abc_NtkManCutStop(local_40);
  Abc_NtkManRefStop(p_00);
  Abc_NtkReassignIds(pNtk);
  if (local_5c == 0) {
    Abc_NtkLevel(pNtk);
  }
  else {
    Abc_NtkStopReverseLevels(pNtk);
  }
  iVar1 = Abc_NtkCheck(pNtk);
  if (iVar1 == 0) {
    puts("Abc_NtkRefactor: The network check has failed.");
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int Abc_NtkRefactor( Abc_Ntk_t * pNtk, int nNodeSizeMax, int nConeSizeMax, int fUpdateLevel, int fUseZeros, int fUseDcs, int fVerbose )
{
    extern void           Dec_GraphUpdateNetwork( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain );
    ProgressBar * pProgress;
    Abc_ManRef_t * pManRef;
    Abc_ManCut_t * pManCut;
    Dec_Graph_t * pFForm;
    Vec_Ptr_t * vFanins;
    Abc_Obj_t * pNode;
    abctime clk, clkStart = Abc_Clock();
    int i, nNodes;

    assert( Abc_NtkIsStrash(pNtk) );
    // cleanup the AIG
    Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
    // start the managers
    pManCut = Abc_NtkManCutStart( nNodeSizeMax, nConeSizeMax, 2, 1000 );
    pManRef = Abc_NtkManRefStart( nNodeSizeMax, nConeSizeMax, fUseDcs, fVerbose );
    pManRef->vLeaves   = Abc_NtkManCutReadCutLarge( pManCut );
    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Abc_NtkStartReverseLevels( pNtk, 0 );

    // resynthesize each node once
    pManRef->nNodesBeg = Abc_NtkNodeNum(pNtk);
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // skip the constant node
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        // skip persistant nodes
        if ( Abc_NodeIsPersistant(pNode) )
            continue;
        // skip the nodes with many fanouts
        if ( Abc_ObjFanoutNum(pNode) > 1000 )
            continue;
        // stop if all nodes have been tried once
        if ( i >= nNodes )
            break;
        // compute a reconvergence-driven cut
clk = Abc_Clock();
        vFanins = Abc_NodeFindCut( pManCut, pNode, fUseDcs );
pManRef->timeCut += Abc_Clock() - clk;
        // evaluate this cut
clk = Abc_Clock();
        pFForm = Abc_NodeRefactor( pManRef, pNode, vFanins, fUpdateLevel, fUseZeros, fUseDcs, fVerbose );
pManRef->timeRes += Abc_Clock() - clk;
        if ( pFForm == NULL )
            continue;
        // acceptable replacement found, update the graph
clk = Abc_Clock();
        Dec_GraphUpdateNetwork( pNode, pFForm, fUpdateLevel, pManRef->nLastGain );
pManRef->timeNtk += Abc_Clock() - clk;
        Dec_GraphFree( pFForm );
    }
    Extra_ProgressBarStop( pProgress );
pManRef->timeTotal = Abc_Clock() - clkStart;
    pManRef->nNodesEnd = Abc_NtkNodeNum(pNtk);

    // print statistics of the manager
    if ( fVerbose )
        Abc_NtkManRefPrintStats( pManRef );
    // delete the managers
    Abc_NtkManCutStop( pManCut );
    Abc_NtkManRefStop( pManRef );
    // put the nodes into the DFS order and reassign their IDs
    Abc_NtkReassignIds( pNtk );
//    Abc_AigCheckFaninOrder( pNtk->pManFunc );
    // fix the levels
    if ( fUpdateLevel )
        Abc_NtkStopReverseLevels( pNtk );
    else
        Abc_NtkLevel( pNtk );
    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkRefactor: The network check has failed.\n" );
        return 0;
    }
    return 1;
}